

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

char * SHA512_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  undefined1 local_f0 [8];
  SHA512_CTX context;
  char *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer._120_8_ = digest;
  SHA512_Init((SHA512_CTX *)local_f0);
  SHA512_Update((SHA512_CTX *)local_f0,data,len);
  pcVar1 = SHA512_End((SHA512_CTX *)local_f0,(char *)context.buffer._120_8_);
  return pcVar1;
}

Assistant:

char* SHA512_Data(const sha2_byte* data, size_t len, char digest[SHA512_DIGEST_STRING_LENGTH]) {
	SHA512_CTX	context;

	SHA512_Init(&context);
	SHA512_Update(&context, data, len);
	return SHA512_End(&context, digest);
}